

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  ushort uVar1;
  int iVar2;
  undefined4 in_register_0000000c;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  iVar4 = (int)first;
  if (iVar4 < (int)(uint)(ushort)c->width) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                ,0x12f,"stbrp__skyline_find_min_y","ImGui ASSERT FAILED: %s");
  }
  if ((int)(uint)**(ushort **)&c->align <= iVar4) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                ,0x136,"stbrp__skyline_find_min_y","ImGui ASSERT FAILED: %s");
  }
  if (iVar4 < (int)(uint)(ushort)c->width) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                ,0x139,"stbrp__skyline_find_min_y","ImGui ASSERT FAILED: %s");
  }
  uVar1 = (ushort)c->width;
  uVar7 = 0;
  iVar2 = 0;
  if ((int)(uint)uVar1 < x0 + iVar4) {
    iVar2 = 0;
    iVar3 = 0;
    uVar7 = 0;
    do {
      uVar5 = (uint)uVar1;
      uVar1 = *(ushort *)((long)&c->width + 2);
      if (uVar7 < uVar1) {
        iVar6 = (uVar1 - uVar7) * iVar3;
        uVar7 = (uint)uVar1;
        if ((int)uVar5 < iVar4) {
          iVar8 = (uint)**(ushort **)&c->align - iVar4;
        }
        else {
          iVar8 = **(ushort **)&c->align - uVar5;
        }
      }
      else {
        iVar6 = **(ushort **)&c->align - uVar5;
        iVar8 = x0 - iVar3;
        if (iVar6 + iVar3 <= x0) {
          iVar8 = iVar6;
        }
        iVar6 = (uVar7 - uVar1) * iVar8;
      }
      iVar2 = iVar2 + iVar6;
      iVar3 = iVar3 + iVar8;
      c = *(stbrp_context **)&c->align;
      uVar1 = (ushort)c->width;
    } while ((int)(uint)uVar1 < x0 + iVar4);
  }
  *(int *)CONCAT44(in_register_0000000c,width) = iVar2;
  return uVar7;
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}